

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void db_destroy_test_full_path(void)

{
  int iVar1;
  fdb_status fVar2;
  time_t tVar3;
  char cmd [256];
  char path [256];
  fdb_status s;
  fdb_config config;
  fdb_file_handle *dbfile;
  int r;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *fhandle;
  undefined1 local_460 [248];
  char local_368 [256];
  undefined1 local_268 [32];
  fdb_config *in_stack_fffffffffffffdb8;
  char *in_stack_fffffffffffffdc0;
  fdb_file_handle **in_stack_fffffffffffffdc8;
  undefined1 local_158 [46];
  undefined1 local_12a;
  int local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  fhandle = (fdb_file_handle *)local_268;
  iVar1 = rand();
  sprintf((char *)fhandle,"/tmp/fdb_destroy_test_%d",(long)iVar1 % 10000 & 0xffffffff);
  sprintf(local_368,"rm -rf %s*",local_268);
  local_54 = system(local_368);
  fdb_get_default_config();
  memcpy(local_158,local_460,0xf8);
  local_12a = 1;
  fdb_open(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  fdb_close(fhandle);
  fVar2 = fdb_destroy((char *)cmd._248_8_,(fdb_config *)cmd._240_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x5ea);
    db_destroy_test_full_path::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x5ea,"void db_destroy_test_full_path()");
    }
  }
  fdb_shutdown();
  memleak_end();
  if (db_destroy_test_full_path::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","Database destroy (full path) test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","Database destroy (full path) test");
  }
  return;
}

Assistant:

void db_destroy_test_full_path()
{
    TEST_INIT();

    memleak_start();
    randomize();

    int r;
    fdb_file_handle *dbfile;
    fdb_config config;
    fdb_status s;
    char path[256];
    char cmd[256];

    sprintf(path, "/tmp/fdb_destroy_test_%d", random(10000));

    sprintf(cmd, "rm -rf %s*", path);
    r = system(cmd); (void)r;

    config = fdb_get_default_config();
    config.compaction_mode = FDB_COMPACTION_AUTO;

    fdb_open(&dbfile, path, &config);
    fdb_close(dbfile);

    s = fdb_destroy(path, &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    fdb_shutdown();

    memleak_end();

    TEST_RESULT("Database destroy (full path) test");
}